

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtmem.cpp
# Opt level: O3

size_t asmjit::v1_14::VirtMem::detectLargePageSize(void)

{
  Error EVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 *puVar4;
  size_t sVar5;
  size_t i;
  ulong uVar6;
  undefined8 local_b8;
  ulong uStack_b0;
  undefined8 local_a8;
  undefined1 *local_a0;
  undefined1 local_98 [144];
  
  local_a0 = local_98;
  uStack_b0 = 0;
  local_b8 = 0x20;
  local_a8 = 0x87;
  local_98[0] = 0;
  EVar1 = OSUtils::readFile("/sys/kernel/mm/transparent_hugepage/hpage_pmd_size",(String *)&local_b8
                            ,0x10);
  if (EVar1 == 0) {
    uVar2 = local_b8 & 0xff;
    if (0x1e < (local_b8 & 0xff)) {
      uVar2 = uStack_b0;
    }
    if (uVar2 != 0) {
      puVar4 = local_a0;
      if ((byte)local_b8._0_1_ < 0x1f) {
        puVar4 = (undefined1 *)((long)&local_b8 + 1);
      }
      uVar3 = 0;
      uVar6 = 0;
      do {
        if (9 < (byte)puVar4[uVar6] - 0x30) break;
        uVar3 = (ulong)((byte)puVar4[uVar6] - 0x30) + uVar3 * 10;
        uVar6 = uVar6 + 1;
      } while (uVar2 != uVar6);
      if (uVar3 != 0) {
        sVar5 = 0;
        if ((uVar3 & uVar3 - 1) == 0) {
          sVar5 = uVar3;
        }
        goto LAB_0012a1a7;
      }
    }
  }
  sVar5 = 0;
LAB_0012a1a7:
  String::reset((String *)&local_b8);
  return sVar5;
}

Assistant:

static size_t detectLargePageSize() noexcept {
#if defined(__APPLE__) && defined(VM_FLAGS_SUPERPAGE_SIZE_2MB) && ASMJIT_ARCH_X86
  return 2u * 1024u * 1024u;
#elif defined(__FreeBSD__)
  Support::Array<size_t, 2> pageSize;
  // TODO: Does it return unsigned?
  return (getpagesizes(pageSize.data(), 2) < 2) ? 0 : uint32_t(pageSize[1]);
#elif defined(__linux__)
  StringTmp<128> storage;
  if (OSUtils::readFile("/sys/kernel/mm/transparent_hugepage/hpage_pmd_size", storage, 16) != kErrorOk || storage.empty())
    return 0u;

  // The first value should be the size of the page (hpage_pmd_size).
  size_t largePageSize = 0;

  const char* buf = storage.data();
  size_t bufSize = storage.size();

  for (size_t i = 0; i < bufSize; i++) {
    uint32_t digit = uint32_t(uint8_t(buf[i]) - uint8_t('0'));
    if (digit >= 10u)
      break;
    largePageSize = largePageSize * 10 + digit;
  }

  if (Support::isPowerOf2(largePageSize))
    return largePageSize;
  else
    return 0u;
#else
  return 0u;
#endif
}